

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

bool __thiscall
duckdb::LogicalType::GetDecimalProperties(LogicalType *this,uint8_t *width,uint8_t *scale)

{
  LogicalTypeId LVar1;
  uint8_t uVar2;
  bool bVar3;
  LogicalType LStack_38;
  
  LVar1 = this->id_;
  switch(LVar1) {
  case BOOLEAN:
    *width = '\x01';
    break;
  case TINYINT:
  case UTINYINT:
    *width = '\x03';
    break;
  case SMALLINT:
  case USMALLINT:
    *width = '\x05';
    break;
  case INTEGER:
  case UINTEGER:
    *width = '\n';
    break;
  case BIGINT:
    *width = '\x13';
    break;
  case DATE:
  case TIME:
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_NS:
  case FLOAT:
  case DOUBLE:
  case CHAR:
  case VARCHAR:
  case BLOB:
  case INTERVAL:
switchD_0135ca33_caseD_f:
    *width = 0xff;
    *scale = 0xff;
    return false;
  case DECIMAL:
    uVar2 = DecimalType::GetWidth(this);
    *width = uVar2;
    uVar2 = DecimalType::GetScale(this);
    *scale = uVar2;
    return true;
  case UBIGINT:
    *width = '\x14';
    break;
  default:
    if (LVar1 != HUGEINT) {
      if (LVar1 == INTEGER_LITERAL) {
        IntegerLiteral::GetType(&LStack_38,this);
        bVar3 = GetDecimalProperties(&LStack_38,width,scale);
        ~LogicalType(&LStack_38);
        return bVar3;
      }
      if (LVar1 != UHUGEINT) {
        if (LVar1 == SQLNULL) {
          *width = '\0';
          *scale = '\0';
          return true;
        }
        goto switchD_0135ca33_caseD_f;
      }
    }
    *width = '&';
  }
  *scale = '\0';
  return true;
}

Assistant:

bool LogicalType::GetDecimalProperties(uint8_t &width, uint8_t &scale) const {
	switch (id_) {
	case LogicalTypeId::SQLNULL:
		width = 0;
		scale = 0;
		break;
	case LogicalTypeId::BOOLEAN:
		width = 1;
		scale = 0;
		break;
	case LogicalTypeId::TINYINT:
		// tinyint: [-127, 127] = DECIMAL(3,0)
		width = 3;
		scale = 0;
		break;
	case LogicalTypeId::SMALLINT:
		// smallint: [-32767, 32767] = DECIMAL(5,0)
		width = 5;
		scale = 0;
		break;
	case LogicalTypeId::INTEGER:
		// integer: [-2147483647, 2147483647] = DECIMAL(10,0)
		width = 10;
		scale = 0;
		break;
	case LogicalTypeId::BIGINT:
		// bigint: [-9223372036854775807, 9223372036854775807] = DECIMAL(19,0)
		width = 19;
		scale = 0;
		break;
	case LogicalTypeId::UTINYINT:
		// UInt8 — [0 : 255]
		width = 3;
		scale = 0;
		break;
	case LogicalTypeId::USMALLINT:
		// UInt16 — [0 : 65535]
		width = 5;
		scale = 0;
		break;
	case LogicalTypeId::UINTEGER:
		// UInt32 — [0 : 4294967295]
		width = 10;
		scale = 0;
		break;
	case LogicalTypeId::UBIGINT:
		// UInt64 — [0 : 18446744073709551615]
		width = 20;
		scale = 0;
		break;
	case LogicalTypeId::HUGEINT:
		// hugeint: max size decimal (38, 0)
		// note that a hugeint is not guaranteed to fit in this
		width = 38;
		scale = 0;
		break;
	case LogicalTypeId::UHUGEINT:
		// hugeint: max size decimal (38, 0)
		// note that a uhugeint is not guaranteed to fit in this
		width = 38;
		scale = 0;
		break;
	case LogicalTypeId::DECIMAL:
		width = DecimalType::GetWidth(*this);
		scale = DecimalType::GetScale(*this);
		break;
	case LogicalTypeId::INTEGER_LITERAL:
		return IntegerLiteral::GetType(*this).GetDecimalProperties(width, scale);
	default:
		// Nonsense values to ensure initialization
		width = 255u;
		scale = 255u;
		// FIXME(carlo): This should be probably a throw, requires checkign the various call-sites
		return false;
	}
	return true;
}